

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void VisitExpressionTreeNodes
               (ExprBase *expression,void *context,_func_void_void_ptr_ExprBase_ptr *accept)

{
  long lVar1;
  long lVar2;
  long lVar3;
  TypeBase *pTVar4;
  SynBase *pSVar5;
  ExprBase *pEVar6;
  ulong uVar7;
  long lVar8;
  _func_int *p_Var9;
  _func_int **pp_Var10;
  
  do {
    if (expression == (ExprBase *)0x0) {
      return;
    }
    (*accept)(context,expression);
    if (expression->typeID == 0) {
      if (expression[1].typeID == 0) {
        return;
      }
      uVar7 = 0;
      do {
        VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase[uVar7],context,accept);
        uVar7 = uVar7 + 1;
      } while (uVar7 < expression[1].typeID);
      return;
    }
    lVar8 = 0x30;
    if ((expression == (ExprBase *)0x0) || (expression->typeID != 0xe)) {
      if ((expression != (ExprBase *)0x0) && (expression->typeID == 0xf)) {
        for (pEVar6 = (ExprBase *)expression[1]._vptr_ExprBase; pEVar6 != (ExprBase *)0x0;
            pEVar6 = pEVar6->next) {
          VisitExpressionTreeNodes(pEVar6,context,accept);
        }
        return;
      }
      if (((((expression == (ExprBase *)0x0) || (expression->typeID != 0x10)) &&
           ((expression == (ExprBase *)0x0 || (expression->typeID != 0x11)))) &&
          ((expression == (ExprBase *)0x0 || (expression->typeID != 0x12)))) &&
         ((expression == (ExprBase *)0x0 || (expression->typeID != 0x13)))) {
        if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x14)) {
LAB_0020ebb7:
          lVar2 = 0x38;
          lVar3 = 0x30;
          goto LAB_0020ebc2;
        }
        if (((expression == (ExprBase *)0x0) || (expression->typeID != 0x16)) &&
           ((expression == (ExprBase *)0x0 || (expression->typeID != 0x17)))) {
          lVar2 = 0x40;
          if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x18)) {
            lVar3 = 0x38;
            lVar1 = 0x30;
            goto LAB_0020ec13;
          }
          lVar2 = 0x38;
          if ((expression == (ExprBase *)0x0) || (lVar3 = 0x30, expression->typeID != 0x19)) {
            if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x1a)) goto LAB_0020ebee;
            if ((expression == (ExprBase *)0x0) || (lVar3 = 0x30, expression->typeID != 0x1b)) {
              lVar3 = 0x38;
              lVar1 = 0x30;
              if ((expression == (ExprBase *)0x0) || (expression->typeID != 0x1c)) {
                lVar2 = 0x40;
                if ((expression == (ExprBase *)0x0) || (expression->typeID != 0x1d)) {
                  if (((expression == (ExprBase *)0x0) || (lVar8 = 0x38, expression->typeID != 0x1e)
                      ) && ((expression == (ExprBase *)0x0 ||
                            (lVar8 = 0x30, expression->typeID != 0x1f)))) {
                    if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x20))
                    goto LAB_0020ebb7;
                    if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x21)) {
                      for (pEVar6 = *(ExprBase **)&expression[1].typeID; pEVar6 != (ExprBase *)0x0;
                          pEVar6 = pEVar6->next) {
                        VisitExpressionTreeNodes(pEVar6,context,accept);
                      }
                      return;
                    }
                    if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x24)) {
                      VisitExpressionTreeNodes(*(ExprBase **)&expression[1].typeID,context,accept);
                      for (pSVar5 = expression[1].source; pSVar5 != (SynBase *)0x0;
                          pSVar5 = (SynBase *)(pSVar5->pos).begin) {
                        VisitExpressionTreeNodes((ExprBase *)pSVar5,context,accept);
                      }
                      VisitExpressionTreeNodes(expression[1].next,context,accept);
                      for (pEVar6 = *(ExprBase **)&expression[1].listed; pEVar6 != (ExprBase *)0x0;
                          pEVar6 = pEVar6->next) {
                        VisitExpressionTreeNodes(pEVar6,context,accept);
                      }
                      return;
                    }
                    if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x25)) {
                      for (pEVar6 = *(ExprBase **)&expression[1].typeID; pEVar6 != (ExprBase *)0x0;
                          pEVar6 = pEVar6->next) {
                        VisitExpressionTreeNodes(pEVar6,context,accept);
                      }
                      return;
                    }
                    if (((expression == (ExprBase *)0x0) ||
                        (lVar8 = 0x38, expression->typeID != 0x26)) &&
                       ((expression == (ExprBase *)0x0 || (lVar8 = 0x40, expression->typeID != 0x27)
                        ))) {
                      if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x28)) {
                        for (pp_Var10 = expression[1]._vptr_ExprBase; pp_Var10 != (_func_int **)0x0;
                            pp_Var10 = (_func_int **)pp_Var10[2]) {
                          VisitExpressionTreeNodes((ExprBase *)pp_Var10[1],context,accept);
                        }
                        return;
                      }
                      if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x29)) {
                        VisitExpressionTreeNodes
                                  ((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
                        for (pEVar6 = *(ExprBase **)&expression[1].typeID; pEVar6 != (ExprBase *)0x0
                            ; pEVar6 = pEVar6->next) {
                          VisitExpressionTreeNodes(pEVar6,context,accept);
                        }
                        return;
                      }
                      if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x2c)) {
                        for (pEVar6 = (ExprBase *)expression[1]._vptr_ExprBase[0x19];
                            pEVar6 != (ExprBase *)0x0; pEVar6 = pEVar6->next) {
                          VisitExpressionTreeNodes(pEVar6,context,accept);
                        }
                        return;
                      }
                      if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x2d)) {
                        for (pTVar4 = expression[1].type; pTVar4 != (TypeBase *)0x0;
                            pTVar4 = (TypeBase *)pTVar4->importModule) {
                          VisitExpressionTreeNodes((ExprBase *)pTVar4,context,accept);
                        }
                        for (p_Var9 = expression[1]._vptr_ExprBase[0xf]; p_Var9 != (_func_int *)0x0;
                            p_Var9 = *(_func_int **)(p_Var9 + 0x10)) {
                          VisitExpressionTreeNodes(*(ExprBase **)(p_Var9 + 8),context,accept);
                        }
                        return;
                      }
                      if ((expression != (ExprBase *)0x0) && (expression->typeID == 0x2e)) {
                        for (p_Var9 = expression[1]._vptr_ExprBase[0xf]; p_Var9 != (_func_int *)0x0;
                            p_Var9 = *(_func_int **)(p_Var9 + 0x10)) {
                          VisitExpressionTreeNodes(*(ExprBase **)(p_Var9 + 8),context,accept);
                        }
                        goto LAB_0020ebc2;
                      }
                      if ((expression == (ExprBase *)0x0) || (expression->typeID != 0x2f)) {
                        if ((expression == (ExprBase *)0x0) || (expression->typeID != 0x30)) {
                          lVar2 = 0x38;
                          lVar3 = 0x30;
                          if (((expression == (ExprBase *)0x0) || (expression->typeID != 0x31)) &&
                             ((expression == (ExprBase *)0x0 || (expression->typeID != 0x32)))) {
                            if ((expression == (ExprBase *)0x0) || (expression->typeID != 0x33)) {
                              lVar8 = 0x30;
                              if (((expression == (ExprBase *)0x0) || (expression->typeID != 0x34))
                                 && ((expression == (ExprBase *)0x0 || (expression->typeID != 0x35))
                                    )) {
                                if ((expression == (ExprBase *)0x0) || (expression->typeID != 0x36))
                                {
                                  if (expression != (ExprBase *)0x0 && expression->typeID == 0x37) {
                                    if (expression[1].typeID == 0) {
                                      return;
                                    }
                                    uVar7 = 0;
                                    do {
                                      VisitExpressionTreeNodes
                                                ((ExprBase *)expression[1]._vptr_ExprBase[uVar7],
                                                 context,accept);
                                      uVar7 = uVar7 + 1;
                                    } while (uVar7 < expression[1].typeID);
                                    return;
                                  }
                                  if (expression == (ExprBase *)0x0) {
                                    return;
                                  }
                                  if (expression->typeID != 0x38) {
                                    return;
                                  }
                                  for (pEVar6 = (ExprBase *)expression[7]._vptr_ExprBase;
                                      pEVar6 != (ExprBase *)0x0; pEVar6 = pEVar6->next) {
                                    VisitExpressionTreeNodes(pEVar6,context,accept);
                                  }
                                  for (pSVar5 = expression[7].source; pSVar5 != (SynBase *)0x0;
                                      pSVar5 = (SynBase *)(pSVar5->pos).begin) {
                                    VisitExpressionTreeNodes((ExprBase *)pSVar5,context,accept);
                                  }
                                  return;
                                }
                                lVar8 = 0x40;
                                for (pEVar6 = (ExprBase *)expression[1]._vptr_ExprBase;
                                    pEVar6 != (ExprBase *)0x0; pEVar6 = pEVar6->next) {
                                  VisitExpressionTreeNodes(pEVar6,context,accept);
                                }
                              }
                            }
                            else {
                              VisitExpressionTreeNodes
                                        ((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
                              for (pEVar6 = *(ExprBase **)&expression[1].typeID;
                                  pEVar6 != (ExprBase *)0x0; pEVar6 = pEVar6->next) {
                                VisitExpressionTreeNodes(pEVar6,context,accept);
                              }
                              lVar8 = 0x58;
                              for (pTVar4 = expression[1].type; pTVar4 != (TypeBase *)0x0;
                                  pTVar4 = (TypeBase *)pTVar4->importModule) {
                                VisitExpressionTreeNodes((ExprBase *)pTVar4,context,accept);
                              }
                            }
                            goto LAB_0020ebee;
                          }
                          goto LAB_0020ebc2;
                        }
                        VisitExpressionTreeNodes
                                  ((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
                        lVar2 = 0x48;
                        lVar3 = 0x40;
                        lVar1 = 0x38;
                      }
                      goto LAB_0020ec13;
                    }
                  }
                  goto LAB_0020ebee;
                }
              }
              else {
                lVar2 = 0x40;
              }
LAB_0020ec13:
              VisitExpressionTreeNodes
                        (*(ExprBase **)((long)&expression->_vptr_ExprBase + lVar1),context,accept);
            }
          }
LAB_0020ebc2:
          VisitExpressionTreeNodes
                    (*(ExprBase **)((long)&expression->_vptr_ExprBase + lVar3),context,accept);
          lVar8 = lVar2;
        }
      }
    }
LAB_0020ebee:
    expression = *(ExprBase **)((long)&expression->_vptr_ExprBase + lVar8);
  } while( true );
}

Assistant:

void VisitExpressionTreeNodes(ExprBase *expression, void *context, void(*accept)(void *context, ExprBase *child))
{
	if(!expression)
		return;

	accept(context, expression);

	if(ExprError *node = getType<ExprError>(expression))
	{
		for(unsigned i = 0; i < node->values.size(); i++)
			VisitExpressionTreeNodes(node->values[i], context, accept);
	}
	else if(ExprPassthrough *node = getType<ExprPassthrough>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprArray *node = getType<ExprArray>(expression))
	{
		for(ExprBase *value = node->values.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprPreModify *node = getType<ExprPreModify>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprPostModify *node = getType<ExprPostModify>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprTypeCast *node = getType<ExprTypeCast>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprUnaryOp *node = getType<ExprUnaryOp>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprBinaryOp *node = getType<ExprBinaryOp>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->rhs, context, accept);
	}
	else if(ExprDereference *node = getType<ExprDereference>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprUnboxing *node = getType<ExprUnboxing>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprConditional *node = getType<ExprConditional>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->trueBlock, context, accept);
		VisitExpressionTreeNodes(node->falseBlock, context, accept);
	}
	else if(ExprAssignment *node = getType<ExprAssignment>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->rhs, context, accept);
	}
	else if(ExprMemberAccess *node = getType<ExprMemberAccess>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprArrayIndex *node = getType<ExprArrayIndex>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
		VisitExpressionTreeNodes(node->index, context, accept);
	}
	else if(ExprReturn *node = getType<ExprReturn>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateUpdate, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprYield *node = getType<ExprYield>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateUpdate, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprVariableDefinition *node = getType<ExprVariableDefinition>(expression))
	{
		VisitExpressionTreeNodes(node->initializer, context, accept);
	}
	else if(ExprZeroInitialize *node = getType<ExprZeroInitialize>(expression))
	{
		VisitExpressionTreeNodes(node->address, context, accept);
	}
	else if(ExprArraySetup *node = getType<ExprArraySetup>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->initializer, context, accept);
	}
	else if(ExprVariableDefinitions *node = getType<ExprVariableDefinitions>(expression))
	{
		for(ExprBase *value = node->definitions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(expression))
	{
		VisitExpressionTreeNodes(node->contextArgument, context, accept);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateRead, context, accept);

		for(ExprBase *expr = node->expressions.head; expr; expr = expr->next)
			VisitExpressionTreeNodes(expr, context, accept);
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(expression))
	{
		for(ExprBase *expr = node->contextVariables.head; expr; expr = expr->next)
			VisitExpressionTreeNodes(expr, context, accept);
	}
	else if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(expression))
	{
		VisitExpressionTreeNodes(node->context, context, accept);
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(expression))
	{
		VisitExpressionTreeNodes(node->context, context, accept);
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(expression))
	{
		for(ShortFunctionHandle *arg = node->functions.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg->context, context, accept);
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(expression))
	{
		VisitExpressionTreeNodes(node->function, context, accept);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg, context, accept);
	}
	else if(ExprGenericClassPrototype *node = getType<ExprGenericClassPrototype>(expression))
	{
		for(ExprBase *value = node->genericProtoType->instances.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprClassDefinition *node = getType<ExprClassDefinition>(expression))
	{
		for(ExprBase *value = node->functions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ConstantData *value = node->classType->constants.head; value; value = value->next)
			VisitExpressionTreeNodes(value->value, context, accept);
	}
	else if(ExprEnumDefinition *node = getType<ExprEnumDefinition>(expression))
	{
		for(ConstantData *value = node->enumType->constants.head; value; value = value->next)
			VisitExpressionTreeNodes(value->value, context, accept);

		VisitExpressionTreeNodes(node->toInt, context, accept);
		VisitExpressionTreeNodes(node->toEnum, context, accept);
	}
	else if(ExprIfElse *node = getType<ExprIfElse>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->trueBlock, context, accept);
		VisitExpressionTreeNodes(node->falseBlock, context, accept);
	}
	else if(ExprFor *node = getType<ExprFor>(expression))
	{
		VisitExpressionTreeNodes(node->initializer, context, accept);
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->increment, context, accept);
		VisitExpressionTreeNodes(node->body, context, accept);
	}
	else if(ExprWhile *node = getType<ExprWhile>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->body, context, accept);
	}
	else if(ExprDoWhile *node = getType<ExprDoWhile>(expression))
	{
		VisitExpressionTreeNodes(node->body, context, accept);
		VisitExpressionTreeNodes(node->condition, context, accept);
	}
	else if(ExprSwitch *node = getType<ExprSwitch>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);

		for(ExprBase *value = node->cases.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ExprBase *value = node->blocks.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		VisitExpressionTreeNodes(node->defaultBlock, context, accept);
	}
	else if(ExprBreak *node = getType<ExprBreak>(expression))
	{
		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprContinue *node = getType<ExprContinue>(expression))
	{
		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprBlock *node = getType<ExprBlock>(expression))
	{
		for(ExprBase *value = node->expressions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprSequence *node = getType<ExprSequence>(expression))
	{
		for(unsigned i = 0; i < node->expressions.size(); i++)
			VisitExpressionTreeNodes(node->expressions[i], context, accept);
	}
	else if(ExprModule *node = getType<ExprModule>(expression))
	{
		for(ExprBase *value = node->setup.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
}